

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_map_equal_boolean(void)

{
  size_type sVar1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *ppVar2;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_01;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_02;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_5e0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_5c8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_5b0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_598;
  undefined1 local_589;
  basic_variable<std::allocator<char>_> local_588;
  int local_554;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_550;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_548;
  undefined1 local_4e8 [77];
  undefined1 local_49b [2];
  undefined1 local_499;
  basic_variable<std::allocator<char>_> local_498;
  int local_464;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_460;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_458;
  undefined1 local_3f8 [77];
  undefined1 local_3ab [2];
  undefined1 local_3a9;
  basic_variable<std::allocator<char>_> local_3a8;
  int local_374;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_370;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_368;
  undefined1 local_308 [77];
  undefined1 local_2bb [2];
  undefined1 local_2b9;
  basic_variable<std::allocator<char>_> local_2b8;
  int local_284;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_280;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_278;
  undefined1 local_218 [77];
  undefined1 local_1cb [2];
  undefined1 local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_78,false);
  local_a[0] = trial::dynamic::operator==(&local_48,&local_78);
  local_85[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == variable(false)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdbd,"void equality_suite::compare_map_equal_boolean()",local_a,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_e8,false);
  local_87[0] = trial::dynamic::operator!=(&local_b8,&local_e8);
  local_e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != variable(false)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdbe,"void equality_suite::compare_map_equal_boolean()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_158,true);
  local_eb[0] = trial::dynamic::operator==(&local_128,&local_158);
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == variable(true)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdbf,"void equality_suite::compare_map_equal_boolean()",local_eb,&local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_1c8,true);
  local_15b[0] = trial::dynamic::operator!=(&local_198,&local_1c8);
  local_1c9 = '\x01';
  sVar1 = 0xdc0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != variable(true)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdc0,"void equality_suite::compare_map_equal_boolean()",local_15b,&local_1c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  local_280 = &local_278;
  local_284 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_280,(char (*) [6])"alpha",&local_284);
  local_218._0_8_ = &local_278;
  local_218._8_8_ = 1;
  init._M_len = sVar1;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),
             (basic_map<std::allocator<char>_> *)local_218._0_8_,init);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_2b8,false);
  local_1cb[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),&local_2b8);
  local_2b9 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == variable(false)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdc2,"void equality_suite::compare_map_equal_boolean()",local_1cb,&local_2b9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10));
  ppVar2 = &local_278;
  local_598 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_218;
  do {
    local_598 = local_598 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_598);
  } while (local_598 != ppVar2);
  local_370 = &local_368;
  local_374 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_370,(char (*) [6])"alpha",&local_374);
  local_308._0_8_ = &local_368;
  local_308._8_8_ = 1;
  init_00._M_len = (size_type)ppVar2;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_308 + 0x10),
             (basic_map<std::allocator<char>_> *)local_308._0_8_,init_00);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_3a8,false);
  local_2bb[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_308 + 0x10),&local_3a8);
  local_3a9 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != variable(false)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdc3,"void equality_suite::compare_map_equal_boolean()",local_2bb,&local_3a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_308 + 0x10));
  ppVar2 = &local_368;
  local_5b0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_308;
  do {
    local_5b0 = local_5b0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_5b0);
  } while (local_5b0 != ppVar2);
  local_460 = &local_458;
  local_464 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_460,(char (*) [6])"alpha",&local_464);
  local_3f8._0_8_ = &local_458;
  local_3f8._8_8_ = 1;
  init_01._M_len = (size_type)ppVar2;
  init_01._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_3f8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_3f8._0_8_,init_01);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_498,true);
  local_3ab[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_3f8 + 0x10),&local_498);
  local_499 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == variable(true)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdc4,"void equality_suite::compare_map_equal_boolean()",local_3ab,&local_499);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_498);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_3f8 + 0x10));
  ppVar2 = &local_458;
  local_5c8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_3f8;
  do {
    local_5c8 = local_5c8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_5c8);
  } while (local_5c8 != ppVar2);
  local_550 = &local_548;
  local_554 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_550,(char (*) [6])"alpha",&local_554);
  local_4e8._0_8_ = &local_548;
  local_4e8._8_8_ = 1;
  init_02._M_len = (size_type)ppVar2;
  init_02._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_4e8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_4e8._0_8_,init_02);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_588,true);
  local_49b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_4e8 + 0x10),&local_588);
  local_589 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != variable(true)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdc5,"void equality_suite::compare_map_equal_boolean()",local_49b,&local_589);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_588);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_4e8 + 0x10));
  local_5e0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_4e8;
  do {
    local_5e0 = local_5e0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_5e0);
  } while (local_5e0 != &local_548);
  return;
}

Assistant:

void compare_map_equal_boolean()
{
    TRIAL_PROTOCOL_TEST_EQUAL(map::make() == variable(false), false);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make() != variable(false), true);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make() == variable(true), false);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make() != variable(true), true);

    TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == variable(false), false);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != variable(false), true);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == variable(true), false);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != variable(true), true);
}